

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FeatureSetDefaults::ByteSizeLong(FeatureSetDefaults *this)

{
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_00;
  long lVar1;
  anon_union_40_1_493b367e_for_FeatureSetDefaults_3 aVar2;
  void **ppvVar3;
  const_iterator cVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  
  sVar7 = (size_t)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.defaults_;
  ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar4 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::end
                    (this_00);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = internal::WireFormatLite::
            MessageSize<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                      ((FeatureSetDefaults_FeatureSetEditionDefault *)*ppvVar3);
    sVar7 = sVar7 + sVar5;
  }
  aVar2 = this->field_0;
  if (((undefined1  [40])aVar2 & (undefined1  [40])0x3) != (undefined1  [40])0x0) {
    if (((undefined1  [40])aVar2 & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
      uVar6 = (long)(this->field_0)._impl_.minimum_edition_ | 1;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [40])aVar2 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
      uVar6 = (long)(this->field_0)._impl_.maximum_edition_ | 1;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar7 = sVar7 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar7 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t FeatureSetDefaults::ByteSizeLong() const {
  const FeatureSetDefaults& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FeatureSetDefaults)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault defaults = 1;
    {
      total_size += 1UL * this_._internal_defaults_size();
      for (const auto& msg : this_._internal_defaults()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional .google.protobuf.Edition minimum_edition = 4;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_minimum_edition());
    }
    // optional .google.protobuf.Edition maximum_edition = 5;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_maximum_edition());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}